

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

int lua_checkstack(lua_State *L,int size)

{
  CallInfo *pCVar1;
  int iVar2;
  StkId pTVar3;
  long lVar4;
  int size_local;
  
  pTVar3 = L->top;
  pCVar1 = L->ci;
  lVar4 = (long)size;
  if ((long)L->stack_last - (long)pTVar3 >> 4 <= lVar4) {
    if (1000000 - size < (int)((ulong)((long)pTVar3 - (long)L->stack) >> 4) + 5) {
      return 0;
    }
    size_local = size;
    iVar2 = luaD_rawrunprotected(L,growstack,&size_local);
    if (iVar2 != 0) {
      return 0;
    }
    pTVar3 = L->top;
    lVar4 = (long)size_local;
  }
  if (pCVar1->top < pTVar3 + lVar4) {
    pCVar1->top = pTVar3 + lVar4;
  }
  return 1;
}

Assistant:

LUA_API int lua_checkstack (lua_State *L, int size) {
  int res;
  CallInfo *ci = L->ci;
  lua_lock(L);
  if (L->stack_last - L->top > size)  /* stack large enough? */
    res = 1;  /* yes; check is OK */
  else {  /* no; need to grow stack */
    int inuse = cast_int(L->top - L->stack) + EXTRA_STACK;
    if (inuse > LUAI_MAXSTACK - size)  /* can grow without overflow? */
      res = 0;  /* no */
    else  /* try to grow stack */
      res = (luaD_rawrunprotected(L, &growstack, &size) == LUA_OK);
  }
  if (res && ci->top < L->top + size)
    ci->top = L->top + size;  /* adjust frame top */
  lua_unlock(L);
  return res;
}